

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ImmediatePromiseNode<kj::_::Void>::get
          (ImmediatePromiseNode<kj::_::Void> *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&this->result);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    output.as<T>() = kj::mv(result);
  }